

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.cpp
# Opt level: O3

uint16_t * __thiscall
Apple::IIgs::Video::Video::output_double_high_resolution
          (Video *this,uint16_t *target,int start,int end,int row)

{
  uint16_t uVar1;
  int column;
  long lVar2;
  long lVar3;
  
  uVar1 = II::VideoSwitches<Cycles>::get_row_address(&this->super_VideoSwitches<Cycles>,row);
  if (start < end) {
    column = start * 2;
    lVar2 = (ulong)uVar1 + (long)start;
    lVar3 = (long)end - (long)start;
    do {
      this->ntsc_shift_ =
           this->ntsc_shift_ >> 0xe |
           (uint)this->ram_[lVar2 + 0x10000] << 0x12 | (uint)this->ram_[lVar2] << 0x19;
      target = output_shift(this,target,column);
      column = column + 2;
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  return target;
}

Assistant:

uint16_t *Video::output_double_high_resolution(uint16_t *target, int start, int end, int row) {
	const uint16_t row_address = get_row_address(row);
	for(int c = start; c < end; c++) {
		const uint8_t source[2] = {
			ram_[0x10000 + row_address + c],
			ram_[row_address + c],
		};

		ntsc_shift_ = unsigned(source[1] << 25) | unsigned(source[0] << 18) | (ntsc_shift_ >> 14);
		target = output_shift(target, c*2);
	}

	return target;
}